

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

uint __thiscall spv::Builder::getNumTypeConstituents(Builder *this,Id typeId)

{
  Op OVar1;
  Id IVar2;
  uint uVar3;
  int op;
  Instruction *this_00;
  
  this_00 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start[typeId];
  OVar1 = this_00->opCode;
  switch(OVar1) {
  case OpTypeBool:
  case OpTypeInt:
  case OpTypeFloat:
  case OpTypePointer:
    return 1;
  case OpTypeVector:
  case OpTypeMatrix:
    op = 1;
    break;
  case OpTypeImage:
  case OpTypeSampler:
  case OpTypeSampledImage:
  case OpTypeRuntimeArray:
  case OpTypeOpaque:
switchD_003d2c8a_caseD_19:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x579,"unsigned int spv::Builder::getNumTypeConstituents(Id) const");
  case OpTypeStruct:
    uVar3 = Instruction::getNumOperands(this_00);
    return uVar3;
  default:
    if (OVar1 == OpTypeCooperativeMatrixKHR) {
      return 1;
    }
    if (OVar1 != OpTypeCooperativeVectorNV) {
      if (OVar1 == OpTypeCooperativeMatrixNV) {
        return 1;
      }
      goto switchD_003d2c8a_caseD_19;
    }
  case OpTypeArray:
    IVar2 = Instruction::getIdOperand(this_00,1);
    this_00 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start[IVar2];
    op = 0;
  }
  uVar3 = Instruction::getImmediateOperand(this_00,op);
  return uVar3;
}

Assistant:

unsigned int Builder::getNumTypeConstituents(Id typeId) const
{
    Instruction* instr = module.getInstruction(typeId);

    switch (instr->getOpCode())
    {
    case OpTypeBool:
    case OpTypeInt:
    case OpTypeFloat:
    case OpTypePointer:
        return 1;
    case OpTypeVector:
    case OpTypeMatrix:
        return instr->getImmediateOperand(1);
    case OpTypeCooperativeVectorNV:
    case OpTypeArray:
    {
        Id lengthId = instr->getIdOperand(1);
        return module.getInstruction(lengthId)->getImmediateOperand(0);
    }
    case OpTypeStruct:
        return instr->getNumOperands();
    case OpTypeCooperativeMatrixKHR:
    case OpTypeCooperativeMatrixNV:
        // has only one constituent when used with OpCompositeConstruct.
        return 1;
    default:
        assert(0);
        return 1;
    }
}